

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2edge_distances.cc
# Opt level: O1

S2Point * S2::InterpolateAtDistance
                    (S2Point *__return_storage_ptr__,S1Angle ax_angle,S2Point *a,S2Point *b)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  bool bVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  Vector3_d tangent;
  Vector3_d normal;
  double local_98 [5];
  S2LogMessage local_70;
  S2LogMessage local_60;
  S2LogMessage local_50;
  Vector3_d local_40;
  
  bVar5 = IsUnitLength(a);
  if (!bVar5) {
    S2LogMessage::S2LogMessage
              (&local_50,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_distances.cc"
               ,0x2e,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_50.stream_,"Check failed: S2::IsUnitLength(a) ",0x22);
    if (!bVar5) goto LAB_001f0242;
  }
  bVar5 = IsUnitLength(b);
  if (!bVar5) {
    S2LogMessage::S2LogMessage
              (&local_60,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_distances.cc"
               ,0x2f,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_60.stream_,"Check failed: S2::IsUnitLength(b) ",0x22);
    if (!bVar5) goto LAB_001f0242;
  }
  RobustCrossProd(&local_40,a,b);
  dVar13 = local_40.c_[1] * a->c_[2] - local_40.c_[2] * a->c_[1];
  dVar12 = local_40.c_[2] * a->c_[0] - a->c_[2] * local_40.c_[0];
  dVar10 = a->c_[1] * local_40.c_[0] - local_40.c_[1] * a->c_[0];
  local_98[0] = dVar12;
  local_98[1] = dVar10;
  local_98[2] = 0.0;
  local_98[3] = 0.0;
  local_98[4] = 0.0;
  if ((dVar13 != 0.0) || (NAN(dVar13))) {
    bVar5 = true;
  }
  else {
    lVar6 = 0;
    do {
      bVar5 = lVar6 == 0x10;
      if (bVar5) goto LAB_001effd6;
      pdVar1 = (double *)((long)local_98 + lVar6);
      pdVar2 = (double *)((long)local_98 + lVar6 + 0x18);
      lVar6 = lVar6 + 8;
    } while ((*pdVar1 == *pdVar2) && (!NAN(*pdVar1) && !NAN(*pdVar2)));
    bVar5 = false;
LAB_001effd6:
    bVar5 = (bool)(bVar5 ^ 1);
  }
  if (bVar5) {
    local_98[4] = 0.0;
    local_98[3] = 0.0;
    local_98[2] = 0.0;
    dVar7 = cos(ax_angle.radians_);
    dVar11 = a->c_[0];
    dVar3 = a->c_[1];
    dVar4 = a->c_[2];
    dVar8 = sin(ax_angle.radians_);
    dVar9 = dVar10 * dVar10 + dVar12 * dVar12 + dVar13 * dVar13;
    if (dVar9 < 0.0) {
      dVar9 = sqrt(dVar9);
    }
    else {
      dVar9 = SQRT(dVar9);
    }
    dVar8 = dVar8 / dVar9;
    dVar13 = dVar11 * dVar7 + dVar13 * dVar8;
    dVar11 = dVar3 * dVar7 + dVar12 * dVar8;
    dVar12 = dVar7 * dVar4 + dVar10 * dVar8;
    dVar10 = dVar12 * dVar12 + dVar11 * dVar11 + dVar13 * dVar13;
    if (dVar10 < 0.0) {
      dVar10 = sqrt(dVar10);
    }
    else {
      dVar10 = SQRT(dVar10);
    }
    dVar10 = (double)(~-(ulong)(dVar10 != 0.0) & (ulong)dVar10 |
                     (ulong)(1.0 / dVar10) & -(ulong)(dVar10 != 0.0));
    __return_storage_ptr__->c_[0] = dVar13 * dVar10;
    __return_storage_ptr__->c_[1] = dVar11 * dVar10;
    __return_storage_ptr__->c_[2] = dVar12 * dVar10;
    return __return_storage_ptr__;
  }
  S2LogMessage::S2LogMessage
            (&local_70,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_distances.cc"
             ,0x36,kFatal,(ostream *)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_70.stream_,"Check failed: tangent != S2Point(0, 0, 0) ",0x2a);
LAB_001f0242:
  abort();
}

Assistant:

S2Point InterpolateAtDistance(S1Angle ax_angle,
                              const S2Point& a, const S2Point& b) {
  double ax = ax_angle.radians();

  S2_DCHECK(S2::IsUnitLength(a));
  S2_DCHECK(S2::IsUnitLength(b));

  // Use RobustCrossProd() to compute the tangent vector at A towards B.  The
  // result is always perpendicular to A, even if A=B or A=-B, but it is not
  // necessarily unit length.  (We effectively normalize it below.)
  Vector3_d normal = S2::RobustCrossProd(a, b);
  Vector3_d tangent = normal.CrossProd(a);
  S2_DCHECK(tangent != S2Point(0, 0, 0));

  // Now compute the appropriate linear combination of A and "tangent".  With
  // infinite precision the result would always be unit length, but we
  // normalize it anyway to ensure that the error is within acceptable bounds.
  // (Otherwise errors can build up when the result of one interpolation is
  // fed into another interpolation.)
  return (cos(ax) * a + (sin(ax) / tangent.Norm()) * tangent).Normalize();
}